

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall
PhyloTree::PhyloTree(PhyloTree *this,PhyloTree *other,vector<int,_std::allocator<int>_> *missing)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  void *this_00;
  mapped_type *pmVar7;
  size_t sVar8;
  reference pvVar9;
  reference pvVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  string *this_01;
  long in_RSI;
  string *in_RDI;
  double dVar12;
  reference rVar13;
  PhyloTreeEdge check;
  pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo> *item_1
  ;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  *__range1_2;
  EdgeInfo info_3;
  size_t index;
  bitset_t leaf_split;
  size_t i_1;
  size_t size;
  mapped_type *info_2;
  mapped_type *info_1;
  size_t ix;
  EdgeInfo info;
  PhyloTreeEdge *edge_copy;
  bitset_t pruned;
  PhyloTreeEdge *edge;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  int inner_edge_counter;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  hashmap;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *item;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range1;
  size_t i;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  name_indices;
  vector<double,_std::allocator<double>_> pruned_lengths;
  undefined4 in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7ec;
  PhyloTreeEdge *in_stack_fffffffffffff7f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff7f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff800;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff808;
  EdgeInfo *in_stack_fffffffffffff810;
  size_type in_stack_fffffffffffff818;
  undefined6 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff826;
  undefined1 in_stack_fffffffffffff827;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff828;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> in_stack_fffffffffffff830;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff838;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff840;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff848;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff850;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff880;
  bitset_t *in_stack_fffffffffffff888;
  mapped_type *in_stack_fffffffffffff8f8;
  undefined7 in_stack_fffffffffffff900;
  byte in_stack_fffffffffffff907;
  bool local_6e9;
  PhyloTreeEdge *in_stack_fffffffffffff9c8;
  string local_478 [64];
  PhyloTreeEdge local_438;
  reference local_3f0;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_3e8;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_3e0;
  undefined1 *local_3d8;
  value_type local_3d0;
  string local_3c8 [32];
  int local_3a8;
  byte local_3a4;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_3a0;
  byte local_391;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_370;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_368;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_360 [5];
  size_t local_338;
  reference local_330;
  ulong local_2f8;
  ulong local_2f0;
  mapped_type *local_2e8;
  mapped_type *local_2a0;
  size_t local_278;
  double local_250;
  string local_248 [32];
  int local_228;
  byte local_224;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_220 [5];
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_1f8;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_1f0;
  _Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
  local_1e8;
  string local_1e0 [32];
  reference local_1c0;
  reference local_178;
  PhyloTreeEdge *local_170;
  __normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_168;
  long local_160;
  int local_154;
  undefined1 local_150 [56];
  reference local_118;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_110;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_108;
  undefined1 *local_100;
  ulong local_f8;
  undefined1 local_f0 [56];
  double *local_b8;
  double *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined8 local_98;
  vector<double,_std::allocator<double>_> *local_90;
  int *local_88;
  int *local_80;
  double *local_78;
  double *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  int *local_50;
  int *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  vector<double,_std::allocator<double>_> local_30;
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x170588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1705a1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1705ba);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1705c7);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,in_stack_fffffffffffff840,
             in_stack_fffffffffffff838,
             (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )in_stack_fffffffffffff830.container);
  local_70 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_78 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_80 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_90 = (vector<double,_std::allocator<double>_> *)
             std::back_inserter<std::vector<double,std::allocator<double>>>
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff850._M_current,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff848._M_current,in_stack_fffffffffffff840,
             in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RDI + 0x38));
  local_98 = 0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffff827,
                      CONCAT16(in_stack_fffffffffffff826,in_stack_fffffffffffff820)),
             in_stack_fffffffffffff818,&in_stack_fffffffffffff810->length);
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - pruned_names");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - pruned_lengths");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_b0 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_b8 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff800._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff7f8._M_current);
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)0x1708ad);
  local_6e9 = (bool)in_stack_fffffffffffff907;
  for (local_f8 = 0; uVar1 = local_f8,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x38)), uVar2 = local_f8, uVar1 < sVar5; local_f8 = local_f8 + 1)
  {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x38),local_f8);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_fffffffffffff7f0,
                          (key_type *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8))
    ;
    *pmVar6 = uVar2;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - name_indices");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_100 = local_f0;
  local_108._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_110._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  while (bVar3 = std::__detail::operator!=(&local_108,&local_110), bVar3) {
    local_118 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                             *)0x170a1f);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_118);
    poVar4 = std::operator<<(poVar4," ");
    this_00 = (void *)std::ostream::operator<<(poVar4,local_118->second);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                  *)in_stack_fffffffffffff7f0);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  ::unordered_map((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                   *)0x170af0);
  local_154 = 0;
  local_160 = local_10 + 0x20;
  local_168._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                  CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_170 = (PhyloTreeEdge *)
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)in_stack_fffffffffffff7f0,
                            (__normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                             *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)), bVar3
        ) {
    local_178 = __gnu_cxx::
                __normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                ::operator*(&local_168);
    Bipartition::getPartition
              ((Bipartition *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    Tools::prune_bitset<std::vector<int,std::allocator<int>>>
              (in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff7f0);
    local_1c0 = local_178;
    poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - edge = ");
    (**(local_1c0->super_Bipartition)._vptr_Bipartition)(local_1e0);
    poVar4 = std::operator<<(poVar4,local_1e0);
    std::operator<<(poVar4," pruned = ");
    pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                CONCAT17(local_6e9,in_stack_fffffffffffff900),
                                (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                in_stack_fffffffffffff8f8);
    std::ostream::operator<<(pbVar11,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    local_1e8._M_cur =
         (__node_type *)
         std::
         unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
         ::find((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                 *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                (key_type *)0x170c8a);
    local_1f0._M_cur =
         (__node_type *)
         std::
         unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
         ::end((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    bVar3 = std::__detail::operator==(&local_1e8,&local_1f0);
    if (bVar3) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (in_stack_fffffffffffff808);
      local_1f8._M_cur =
           (__node_type *)
           std::
           unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
           ::find((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                   *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                  (key_type *)0x170d03);
      local_220[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
           ::end((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      bVar3 = std::__detail::operator==(&local_1f8,local_220);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff7f0);
      if (bVar3) {
        EdgeInfo::EdgeInfo(in_stack_fffffffffffff810);
        local_250 = PhyloTreeEdge::getLength(local_178);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff7f0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        bVar3 = Tools::is_leaf((bitset_t *)in_stack_fffffffffffff800._M_current);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff7f0);
        if (bVar3) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff7f0,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
          sVar8 = Tools::leaf_index_nothrow((bitset_t *)in_stack_fffffffffffff848._M_current);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff7f0);
          local_278 = sVar8;
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(in_RDI + 0x38),sVar8);
          std::__cxx11::string::operator=(local_248,(string *)pvVar9);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_278);
          local_250 = *pvVar10 + local_250;
          local_224 = 1;
        }
        else {
          local_228 = local_154;
          local_154 = local_154 + 1;
        }
        std::
        unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
        ::operator[]((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                      *)in_stack_fffffffffffff7f0,
                     (key_type *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        EdgeInfo::operator=((EdgeInfo *)in_stack_fffffffffffff7f0,
                            (EdgeInfo *)
                            CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        std::operator<<((ostream *)&std::cout,"DEBUG - adding hashmap[");
        pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                    CONCAT17(local_6e9,in_stack_fffffffffffff900),
                                    (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
                                    )in_stack_fffffffffffff8f8);
        poVar4 = std::operator<<(pbVar11,"] = {");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_250);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,local_248);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_228);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_224 & 1));
        poVar4 = std::operator<<(poVar4,"}");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        EdgeInfo::~EdgeInfo((EdgeInfo *)0x17119c);
      }
      else {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  (in_stack_fffffffffffff808);
        pmVar7 = std::
                 unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                 ::operator[]((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                               *)in_stack_fffffffffffff7f0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff7f0);
        local_2a0 = pmVar7;
        dVar12 = PhyloTreeEdge::getLength(local_178);
        local_2a0->length = local_2a0->length + dVar12;
        std::operator<<((ostream *)&std::cout,"DEBUG - altering hashmap[");
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  (in_stack_fffffffffffff808);
        pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                    CONCAT17(local_6e9,in_stack_fffffffffffff900),
                                    (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
                                    )in_stack_fffffffffffff8f8);
        poVar4 = std::operator<<(pbVar11,"] = {");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a0->length);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)&local_2a0->name);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2a0->id);
        poVar4 = std::operator<<(poVar4,", ");
        in_stack_fffffffffffff9c8 =
             (PhyloTreeEdge *)std::ostream::operator<<(poVar4,(bool)(local_2a0->leaf & 1));
        poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff9c8,"} (complement)");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff7f0);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      local_2e8 = std::
                  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                  ::operator[]((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                                *)in_stack_fffffffffffff7f0,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      dVar12 = PhyloTreeEdge::getLength(local_178);
      local_2e8->length = local_2e8->length + dVar12;
      std::operator<<((ostream *)&std::cout,"DEBUG - altering hashmap[");
      pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                  CONCAT17(local_6e9,in_stack_fffffffffffff900),
                                  (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffff8f8);
      poVar4 = std::operator<<(pbVar11,"] = {");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2e8->length);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&local_2e8->name);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2e8->id);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_2e8->leaf & 1));
      poVar4 = std::operator<<(poVar4,"}");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff7f0);
    __gnu_cxx::
    __normal_iterator<const_PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_168);
  }
  local_2f0 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 0x38));
  for (local_2f8 = 0; local_2f8 < local_2f0; local_2f8 = local_2f8 + 1) {
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1716fb);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff810,(size_type)in_stack_fffffffffffff808,
               (unsigned_long)in_stack_fffffffffffff800._M_current,
               (allocator<unsigned_long> *)in_stack_fffffffffffff7f8._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x17172b);
    rVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffff800._M_current,
                        (size_type)in_stack_fffffffffffff7f8._M_current);
    local_330 = rVar13;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
              ((reference *)in_stack_fffffffffffff7f0,
               SUB41((uint)in_stack_fffffffffffff7ec >> 0x18,0));
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff7f0,
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    sVar8 = Tools::leaf_index_nothrow((bitset_t *)in_stack_fffffffffffff848._M_current);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff7f0);
    local_391 = 0;
    local_338 = sVar8;
    local_360[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
         ::find((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                 *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                (key_type *)0x1717fc);
    local_368._M_cur =
         (__node_type *)
         std::
         unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
         ::end((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    bVar3 = std::__detail::operator==(local_360,&local_368);
    local_6e9 = false;
    if (bVar3) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (in_stack_fffffffffffff808);
      local_391 = 1;
      local_370._M_cur =
           (__node_type *)
           std::
           unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
           ::find((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                   *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                  (key_type *)0x171886);
      local_3a0._M_cur =
           (__node_type *)
           std::
           unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
           ::end((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                  *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      local_6e9 = std::__detail::operator==(&local_370,&local_3a0);
    }
    if ((local_391 & 1) != 0) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff7f0);
    }
    if ((local_6e9 & 1U) != 0) {
      EdgeInfo::EdgeInfo(in_stack_fffffffffffff810);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x38),local_338);
      std::__cxx11::string::operator=(local_3c8,(string *)pvVar9);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_338);
      local_3d0 = *pvVar10;
      local_3a4 = 1;
      in_stack_fffffffffffff8f8 =
           std::
           unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
           ::operator[]((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                         *)in_stack_fffffffffffff7f0,
                        (key_type *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      EdgeInfo::operator=((EdgeInfo *)in_stack_fffffffffffff7f0,
                          (EdgeInfo *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8))
      ;
      std::operator<<((ostream *)&std::cout,"DEBUG - adding leaf hashmap[");
      pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                  CONCAT17(local_6e9,in_stack_fffffffffffff900),
                                  (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffff8f8);
      poVar4 = std::operator<<(pbVar11,"] = {");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3d0);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,local_3c8);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3a8);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_3a4 & 1));
      poVar4 = std::operator<<(poVar4,"}");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      EdgeInfo::~EdgeInfo((EdgeInfo *)0x171b49);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff7f0);
  }
  local_3d8 = local_150;
  local_3e0._M_cur =
       (__node_type *)
       std::
       unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
       ::begin((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_3e8._M_cur =
       (__node_type *)
       std::
       unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
       ::end((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
              *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  while( true ) {
    bVar3 = std::__detail::operator!=(&local_3e0,&local_3e8);
    if (!bVar3) break;
    local_3f0 = std::__detail::
                _Node_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_false,_true>
                             *)0x171c9f);
    std::operator<<((ostream *)&std::cout,"DEBUG - hashmap key: ");
    pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                CONCAT17(local_6e9,in_stack_fffffffffffff900),
                                (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                in_stack_fffffffffffff8f8);
    poVar4 = std::operator<<(pbVar11,", value: {");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(local_3f0->second).length);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,(string *)&(local_3f0->second).name);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(local_3f0->second).id);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)((local_3f0->second).leaf & 1));
    poVar4 = std::operator<<(poVar4,"}");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (((local_3f0->second).leaf & 1U) == 0) {
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
                        (in_stack_fffffffffffff828);
      if (!bVar3) {
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x171e95
                          );
        if (!bVar3) {
          std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const&,double&,int&>
                    ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                     (double *)in_stack_fffffffffffff800._M_current,
                     (int *)in_stack_fffffffffffff7f8._M_current);
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - PhyloTreeEdge check");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff7f0,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      PhyloTreeEdge::PhyloTreeEdge
                ((PhyloTreeEdge *)in_stack_fffffffffffff800._M_current,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff7f8._M_current,(double)in_stack_fffffffffffff7f0,
                 in_stack_fffffffffffff7ec);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff7f0);
      PhyloTreeEdge::toString_abi_cxx11_(in_stack_fffffffffffff9c8);
      in_stack_fffffffffffff810 = (EdgeInfo *)std::operator<<((ostream *)&std::cout,local_478);
      in_stack_fffffffffffff808 =
           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::operator<<((ostream *)in_stack_fffffffffffff810," ");
      in_stack_fffffffffffff800._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           PhyloTreeEdge::getLength(&local_438);
      in_stack_fffffffffffff7f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<
                     (in_stack_fffffffffffff808,(double)in_stack_fffffffffffff800._M_current);
      std::ostream::operator<<
                (in_stack_fffffffffffff7f8._M_current,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_478);
      in_stack_fffffffffffff7f0 =
           (PhyloTreeEdge *)std::operator<<((ostream *)&std::cout,"DEBUG end");
      std::ostream::operator<<(in_stack_fffffffffffff7f0,std::endl<char,std::char_traits<char>>);
      PhyloTreeEdge::~PhyloTreeEdge(in_stack_fffffffffffff7f0);
    }
    else {
      in_stack_fffffffffffff828 =
           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
           (local_3f0->second).length;
      this_01 = in_RDI + 0x50;
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffff7f0,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)this_01,*pmVar6);
      *pvVar10 = (value_type)in_stack_fffffffffffff828;
    }
    std::__detail::
    _Node_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_false,_true>
                  *)in_stack_fffffffffffff7f0);
  }
  std::
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  ::~unordered_map((unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
                    *)0x1720a7);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)0x1720b4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff800._M_current);
  return;
}

Assistant:

PhyloTree::PhyloTree(const PhyloTree& other, const vector<int>& missing)
{
    vector<double> pruned_lengths;  // temp store relevant edge lengths from other tree

    // TODO: combine these into a single loop
    Tools::prune_container(other.leaf2NumMap.begin(), other.leaf2NumMap.end(),
            missing.begin(), missing.end(), std::back_inserter(this->leaf2NumMap)); // fill pruned leaf2NumMap
    Tools::prune_container(other.leafEdgeLengths.begin(), other.leafEdgeLengths.end(),
            missing.begin(), missing.end(), std::back_inserter(pruned_lengths)); // fill temp lengths store

    this->leafEdgeLengths.resize(this->leaf2NumMap.size(), 0); // initialise leaf lengths vector

#ifdef DEBUGPRINT
    cout << "DEBUG - pruned_names" << endl;
    Tools::vector_print(this->leaf2NumMap.begin(), this->leaf2NumMap.end());

    cout << "DEBUG - pruned_lengths" << endl;
    Tools::vector_print(pruned_lengths.begin(), pruned_lengths.end());
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<string, size_t> name_indices;
    for (size_t i = 0; i<this->leaf2NumMap.size(); i++) {
        name_indices[this->leaf2NumMap[i]] = i;
    }
#ifdef DEBUGPRINT
    cout << "DEBUG - name_indices" << endl;
    for (auto& item: name_indices) {
        cout << item.first << " " << item.second << endl;
    }
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<bitset_t, EdgeInfo, BitsetHash> hashmap;
    int inner_edge_counter = 0;
    for (auto& edge: other.edges) {
        auto pruned = Tools::prune_bitset(edge.getPartition(), missing);

#ifdef DEBUGPRINT
        auto edge_copy = &edge;
        cout << "DEBUG - edge = " << const_cast<PhyloTreeEdge*>(edge_copy)->toString() << " pruned = " << pruned
                << endl;
#endif


        if (hashmap.find(pruned)==hashmap.end()) {
            if (hashmap.find(~pruned)==hashmap.end()) {
                EdgeInfo info;
                info.length = edge.getLength();
                if (Tools::is_leaf(pruned)) {
                    size_t ix = Tools::leaf_index_nothrow(pruned);
                    info.name = this->leaf2NumMap[ix];
                    info.length += pruned_lengths[ix];
                    info.leaf = true;
                }
                else {
                    info.id = inner_edge_counter++;
                }
                hashmap[pruned] = info;
#ifdef DEBUGPRINT
                cout << "DEBUG - adding hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "}" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
            else {
                auto& info = hashmap[~pruned];
                info.length += edge.getLength();
#ifdef DEBUGPRINT
                cout << "DEBUG - altering hashmap[" << ~pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "} (complement)" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
        }
        else {
            auto& info = hashmap[pruned];
            info.length += edge.getLength();
#ifdef DEBUGPRINT
            cout << "DEBUG - altering hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
    // Add remaining leaves
    size_t size = this->leaf2NumMap.size();
    for (size_t i=0; i < size; ++i) {
        bitset_t leaf_split(size);
        leaf_split[size - i - 1] = true;
        size_t index = Tools::leaf_index_nothrow(leaf_split);
        if (hashmap.find(leaf_split)==hashmap.end() && hashmap.find(~leaf_split)==hashmap.end()) {
            EdgeInfo info;
            info.name = this->leaf2NumMap[index];
            info.length = pruned_lengths[index];
            info.leaf = true;
            hashmap[leaf_split] = info;
#ifdef DEBUGPRINT
            cout << "DEBUG - adding leaf hashmap[" << leaf_split << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }

    // All info to build this PhyloTree is in the hashmap
    for (auto& item : hashmap) {
#ifdef DEBUGPRINT
        cout << "DEBUG - hashmap key: " << item.first << ", value: {" << item.second.length << ", " << item.second.name
                << ", " << item.second.id << ", " << item.second.leaf << "}" << endl;
#endif
        if (item.second.leaf) {
            this->leafEdgeLengths[name_indices[item.second.name]] = item.second.length;
        }
        else {
            if (!item.first.all() && !item.first.none()) {
                this->edges.emplace_back(item.first, item.second.length, item.second.id);
            }
#ifdef DEBUGPRINT
            cout << "DEBUG - PhyloTreeEdge check" << endl;
            PhyloTreeEdge check(item.first, item.second.length, item.second.id);
            cout << check.toString() << " " << check.getLength() << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
}